

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TParseContext::vkRelaxedRemapDotDereference
          (TParseContext *this,TSourceLoc *param_1,TIntermTyped *base,TType *member,
          TString *identifier)

{
  TIntermediate *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  TSymbol *pTVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TIntermTyped *result;
  TSymbol *symbol;
  AccessChainTraverser traverser;
  TString *identifier_local;
  TType *member_local;
  TIntermTyped *base_local;
  TSourceLoc *param_1_local;
  TParseContext *this_local;
  
  traverser._96_8_ = identifier;
  uVar2 = (*member->_vptr_TType[0x28])();
  this_local = (TParseContext *)base;
  if ((uVar2 & 1) != 0) {
    AccessChainTraverser::AccessChainTraverser((AccessChainTraverser *)&symbol);
    (*(base->super_TIntermNode)._vptr_TIntermNode[2])(base,&symbol);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::empty((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    &traverser.super_TIntermTraverser.path.
                     super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                     super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
             &traverser.super_TIntermTraverser.path.
              super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
              super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,".");
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               &traverser.super_TIntermTraverser.path.
                super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               traverser._96_8_);
    pTVar4 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,
                                (TString *)
                                &traverser.super_TIntermTraverser.path.
                                 super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                 .
                                 super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(bool *)0x0,
                                (bool *)0x0,(int *)0x0);
    if (pTVar4 != (TSymbol *)0x0) {
      this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar3 = (*pTVar4->_vptr_TSymbol[10])();
      this_local = (TParseContext *)
                   TIntermediate::addSymbol(this_00,(TVariable *)CONCAT44(extraout_var,iVar3));
      iVar3 = (*pTVar4->_vptr_TSymbol[0xc])();
      (*(this_local->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x1d])
                (this_local,CONCAT44(extraout_var_00,iVar3));
    }
    AccessChainTraverser::~AccessChainTraverser((AccessChainTraverser *)&symbol);
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* TParseContext::vkRelaxedRemapDotDereference(const TSourceLoc&, TIntermTyped& base, const TType& member,
    const TString& identifier)
{
    if (!member.isOpaque())
        return &base;

    AccessChainTraverser traverser{};
    base.traverse(&traverser);
    if (!traverser.path.empty())
        traverser.path.append(".");
    traverser.path.append(identifier);

    const TSymbol* symbol = symbolTable.find(traverser.path);
    if (!symbol)
        return &base;

    TIntermTyped* result = intermediate.addSymbol(*symbol->getAsVariable());
    result->setType(symbol->getType());
    return result;
}